

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

void __thiscall QPDF::inParse(QPDF *this,bool v)

{
  pointer pMVar1;
  logic_error *this_00;
  bool v_local;
  QPDF *this_local;
  
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  if ((bool)(pMVar1->in_parse & 1U) == v) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error
              (this_00,
               "QPDF: re-entrant parsing detected. This is a qpdf bug. Please report at https://github.com/qpdf/qpdf/issues."
              );
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  pMVar1->in_parse = v;
  return;
}

Assistant:

void
QPDF::inParse(bool v)
{
    if (m->in_parse == v) {
        // This happens if QPDFParser::parse tries to resolve an indirect object while it is
        // parsing.
        throw std::logic_error(
            "QPDF: re-entrant parsing detected. This is a qpdf bug."
            " Please report at https://github.com/qpdf/qpdf/issues.");
    }
    m->in_parse = v;
}